

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaTreeItemPtr pxVar3;
  bool bVar4;
  int iVar5;
  xmlSchemaTypePtr pxVar6;
  xmlSchemaModelGroupPtr pxVar7;
  xmlNodePtr pxVar8;
  xmlSchemaTypePtr pxVar9;
  xmlSchemaParticlePtr pxVar10;
  xmlSchemaTreeItemPtr_conflict effectiveContent;
  xmlSchemaParticlePtr particle;
  int dummySequence;
  xmlSchemaTypePtr content;
  xmlSchemaTypePtr contentBase;
  xmlSchemaTypePtr baseType;
  int olderrs;
  int res;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  iVar1 = pctxt->nberrors;
  pxVar6 = type->baseType;
  if ((type->type == XML_SCHEMA_TYPE_BASIC) || ((type->flags & 0x400000U) != 0)) {
    return 0;
  }
  type->flags = type->flags | 0x400000;
  if (pxVar6 == (xmlSchemaTypePtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupComplexType","missing baseType");
  }
  else {
    if ((pxVar6->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar6->flags & 0x400000U) == 0)) {
      xmlSchemaTypeFixup(pxVar6,(xmlSchemaAbstractCtxtPtr)pctxt);
    }
    if ((pxVar6->flags & 0x800000U) != 0) {
      return 0;
    }
    iVar5 = xmlSchemaCheckSRCCT(pctxt,type);
    if (iVar5 == -1) goto LAB_001f19e5;
    if (iVar5 != 0) goto LAB_001f19c9;
    if (type->contentType == XML_SCHEMA_CONTENT_SIMPLE) {
      if ((((pxVar6->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar6->builtInType == 0x2d)) &&
          (pxVar6->contentTypeDef != (xmlSchemaTypePtr)0x0)) && ((type->flags & 4U) != 0)) {
        if (type->contentTypeDef == (xmlSchemaTypePtr)0x0) {
          content = pxVar6->contentTypeDef;
        }
        else {
          content = type->contentTypeDef;
          type->contentTypeDef = (xmlSchemaTypePtr)0x0;
        }
        pxVar6 = xmlSchemaAddType(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                                  type->targetNamespace,type->node,0);
        if (pxVar6 == (xmlSchemaTypePtr)0x0) goto LAB_001f19e5;
        pxVar6->type = XML_SCHEMA_TYPE_SIMPLE;
        pxVar6->baseType = content;
        pxVar6->facets = type->facets;
        type->facets = (xmlSchemaFacetPtr)0x0;
        pxVar6->facetSet = type->facetSet;
        type->facetSet = (xmlSchemaFacetLinkPtr)0x0;
        type->contentTypeDef = pxVar6;
        if ((content->type != XML_SCHEMA_TYPE_BASIC) && ((content->flags & 0x400000U) == 0)) {
          xmlSchemaTypeFixup(content,(xmlSchemaAbstractCtxtPtr)pctxt);
        }
        iVar5 = xmlSchemaFixupSimpleTypeStageOne(pctxt,pxVar6);
        if (iVar5 == -1) goto LAB_001f19e5;
        if (iVar5 != 0) goto LAB_001f19c9;
        iVar5 = xmlSchemaFixupSimpleTypeStageTwo(pctxt,pxVar6);
        if (iVar5 == -1) goto LAB_001f19e5;
        if (iVar5 != 0) goto LAB_001f19c9;
      }
      else if (((pxVar6->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar6->builtInType == 0x2d)) &&
              ((pxVar6->contentType == XML_SCHEMA_CONTENT_MIXED && ((type->flags & 4U) != 0)))) {
        if ((type->contentTypeDef == (xmlSchemaTypePtr)0x0) ||
           (type->contentTypeDef->baseType == (xmlSchemaTypePtr)0x0)) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0
                              ,
                              "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <simpleContent><restriction> is missing a <simpleType> child, but was not caught by xmlSchemaCheckSRCCT()"
                              ,type->name);
          goto LAB_001f19e5;
        }
      }
      else if (((pxVar6->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar6->builtInType == 0x2d)) &&
              ((type->flags & 2U) != 0)) {
        if (pxVar6->contentTypeDef == (xmlSchemaTypePtr)0x0) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0
                              ,
                              "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <extension>ed base type is a complex type with no simple content type"
                              ,type->name);
          goto LAB_001f19e5;
        }
        type->contentTypeDef = pxVar6->contentTypeDef;
      }
      else {
        if (((pxVar6->type != XML_SCHEMA_TYPE_SIMPLE) &&
            ((pxVar6->type != XML_SCHEMA_TYPE_BASIC || (pxVar6->builtInType == 0x2d)))) ||
           ((type->flags & 2U) == 0)) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0
                              ,
                              "Internal error: xmlSchemaTypeFixup, complex type \'%s\' with <simpleContent>: unhandled derivation case"
                              ,type->name);
          goto LAB_001f19e5;
        }
        type->contentTypeDef = pxVar6;
      }
    }
    else {
      bVar4 = false;
      effectiveContent = (xmlSchemaTreeItemPtr_conflict)type->subtypes;
      if (((xmlSchemaTypePtr)effectiveContent == (xmlSchemaTypePtr)0x0) ||
         (((((xmlSchemaTypePtr)effectiveContent)->type == XML_SCHEMA_TYPE_PARTICLE &&
           (((*(int *)((xmlSchemaTypePtr)effectiveContent)->id == 8 ||
             (*(int *)((xmlSchemaTypePtr)effectiveContent)->id == 6)) ||
            ((*(int *)((xmlSchemaTypePtr)effectiveContent)->id == 7 &&
             (*(int *)&((xmlSchemaTypePtr)effectiveContent)->ref == 0)))))) &&
          (*(long *)(((xmlSchemaTypePtr)effectiveContent)->id + 0x18) == 0)))) {
        if ((type->flags & 1U) == 0) {
          type->contentType = XML_SCHEMA_CONTENT_EMPTY;
        }
        else {
          if (((xmlSchemaTypePtr)effectiveContent == (xmlSchemaTypePtr)0x0) ||
             (*(int *)((xmlSchemaTypePtr)effectiveContent)->id != 6)) {
            effectiveContent =
                 (xmlSchemaTreeItemPtr_conflict)xmlSchemaAddParticle(pctxt,type->node,1,1);
            if ((xmlSchemaTypePtr)effectiveContent == (xmlSchemaTypePtr)0x0) goto LAB_001f19e5;
            pxVar7 = xmlSchemaAddModelGroup(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node)
            ;
            ((xmlSchemaTypePtr)effectiveContent)->id = (xmlChar *)pxVar7;
            if ((xmlSchemaTreeItemPtr_conflict)((xmlSchemaTypePtr)effectiveContent)->id ==
                (xmlSchemaTreeItemPtr_conflict)0x0) goto LAB_001f19e5;
            type->subtypes = (xmlSchemaTypePtr)effectiveContent;
          }
          bVar4 = true;
          type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
        }
      }
      else {
        type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
      }
      if ((type->flags & 4U) == 0) {
        if (type->contentType == XML_SCHEMA_CONTENT_EMPTY) {
          type->contentType = pxVar6->contentType;
          type->subtypes = pxVar6->subtypes;
          type->contentTypeDef = pxVar6->contentTypeDef;
        }
        else if (pxVar6->contentType == XML_SCHEMA_CONTENT_EMPTY) {
          if ((type->flags & 1U) != 0) {
            type->contentType = XML_SCHEMA_CONTENT_MIXED;
          }
        }
        else {
          if ((type->flags & 1U) != 0) {
            type->contentType = XML_SCHEMA_CONTENT_MIXED;
          }
          if (((type->subtypes == (xmlSchemaTypePtr)0x0) || (type->subtypes->id == (xmlChar *)0x0))
             || (*(int *)type->subtypes->id != 8)) {
            if (((pxVar6->subtypes == (xmlSchemaTypePtr)0x0) ||
                (pxVar6->subtypes->id == (xmlChar *)0x0)) || (*(int *)pxVar6->subtypes->id != 8)) {
              if ((bVar4) || (pxVar6->subtypes == (xmlSchemaTypePtr)0x0)) {
                effectiveContent->children->children = (xmlSchemaTreeItemPtr)pxVar6->subtypes;
              }
              else {
                pxVar2 = type->subtypes;
                pxVar9 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
                if (pxVar9 == (xmlSchemaTypePtr)0x0) goto LAB_001f19e5;
                pxVar7 = xmlSchemaAddModelGroup
                                   (pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node);
                pxVar9->id = (xmlChar *)pxVar7;
                if ((xmlSchemaTreeItemPtr_conflict)pxVar9->id == (xmlSchemaTreeItemPtr_conflict)0x0)
                goto LAB_001f19e5;
                type->subtypes = pxVar9;
                pxVar10 = xmlSchemaAddParticle
                                    (pctxt,type->node,*(int *)&pxVar6->subtypes->ref,
                                     *(int *)((long)&pxVar6->subtypes->ref + 4));
                ((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->children =
                     (xmlSchemaTreeItemPtr)pxVar10;
                if (((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->children ==
                    (xmlSchemaTreeItemPtr)0x0) goto LAB_001f19e5;
                pxVar3 = ((xmlSchemaTreeItemPtr_conflict)pxVar9->id)->children;
                pxVar3->children = (xmlSchemaTreeItemPtr)pxVar6->subtypes->id;
                pxVar3->next = (xmlSchemaTreeItemPtr)pxVar2;
              }
            }
            else {
              pxVar8 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
              xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_COS_ALL_LIMITED,pxVar8,
                                 (xmlSchemaBasicItemPtr)0x0,
                                 "A type cannot be derived by extension from a type which has an \'all\' model group in its {content type}, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
                                 ,(xmlChar *)0x0,(xmlChar *)0x0);
            }
          }
          else {
            pxVar8 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_COS_ALL_LIMITED,pxVar8,
                               (xmlSchemaBasicItemPtr)0x0,
                               "The type has an \'all\' model group in its {content type} and thus cannot be derived from a non-empty type, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
                               ,(xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      else if ((type->contentType != XML_SCHEMA_CONTENT_EMPTY) && ((type->flags & 1U) != 0)) {
        type->contentType = XML_SCHEMA_CONTENT_MIXED;
      }
    }
    iVar5 = xmlSchemaFixupTypeAttributeUses(pctxt,type);
    if (iVar5 != -1) {
      if (iVar5 == 0) {
        iVar5 = xmlSchemaCheckCTComponent(pctxt,type);
        if (iVar5 == -1) goto LAB_001f19e5;
        if (iVar5 == 0) {
          if (iVar1 != pctxt->nberrors) {
            return pctxt->err;
          }
          return 0;
        }
      }
LAB_001f19c9:
      type->flags = type->flags | 0x800000;
      return pctxt->err;
    }
  }
LAB_001f19e5:
  type->flags = type->flags | 0x800000;
  return -1;
}

Assistant:

static int
xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,
			  xmlSchemaTypePtr type)
{
    int res = 0, olderrs = pctxt->nberrors;
    xmlSchemaTypePtr baseType = type->baseType;

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    if (baseType == NULL) {
	PERROR_INT("xmlSchemaFixupComplexType",
	    "missing baseType");
	goto exit_failure;
    }
    /*
    * Fixup the base type.
    */
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	xmlSchemaTypeFixup(baseType, ACTXT_CAST pctxt);
    if (baseType->flags & XML_SCHEMAS_TYPE_INTERNAL_INVALID) {
	/*
	* Skip fixup if the base type is invalid.
	* TODO: Generate a warning!
	*/
	return(0);
    }
    /*
    * This basically checks if the base type can be derived.
    */
    res = xmlSchemaCheckSRCCT(pctxt, type);
    HFAILURE HERROR
    /*
    * Fixup the content type.
    */
    if (type->contentType == XML_SCHEMA_CONTENT_SIMPLE) {
	/*
	* Corresponds to <complexType><simpleContent>...
	*/
	if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentTypeDef != NULL) &&
	    (WXS_IS_RESTRICTION(type))) {
	    xmlSchemaTypePtr contentBase, content;
#ifdef ENABLE_NAMED_LOCALS
	    char buf[30];
	    const xmlChar *tmpname;
#endif
	    /*
	    * SPEC (1) If <restriction> + base type is <complexType>,
	    * "whose own {content type} is a simple type..."
	    */
	    if (type->contentTypeDef != NULL) {
		/*
		* SPEC (1.1) "the simple type definition corresponding to the
		* <simpleType> among the [children] of <restriction> if there
		* is one;"
		* Note that this "<simpleType> among the [children]" was put
		* into ->contentTypeDef during parsing.
		*/
		contentBase = type->contentTypeDef;
		type->contentTypeDef = NULL;
	    } else {
		/*
		* (1.2) "...otherwise (<restriction> has no <simpleType>
		* among its [children]), the simple type definition which
		* is the {content type} of the ... base type."
		*/
		contentBase = baseType->contentTypeDef;
	    }
	    /*
	    * SPEC
	    * "... a simple type definition which restricts the simple
	    * type definition identified in clause 1.1 or clause 1.2
	    * with a set of facet components"
	    *
	    * Create the anonymous simple type, which will be the content
	    * type of the complex type.
	    */
#ifdef ENABLE_NAMED_LOCALS
	    snprintf(buf, 29, "#scST%d", ++(pctxt->counter));
	    tmpname = xmlDictLookup(pctxt->dict, BAD_CAST buf, -1);
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, tmpname, type->targetNamespace,
		type->node, 0);
#else
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, NULL, type->targetNamespace,
		type->node, 0);
#endif
	    if (content == NULL)
		goto exit_failure;
	    /*
	    * We will use the same node as for the <complexType>
	    * to have it somehow anchored in the schema doc.
	    */
	    content->type = XML_SCHEMA_TYPE_SIMPLE;
	    content->baseType = contentBase;
	    /*
	    * Move the facets, previously anchored on the
	    * complexType during parsing.
	    */
	    content->facets = type->facets;
	    type->facets = NULL;
	    content->facetSet = type->facetSet;
	    type->facetSet = NULL;

	    type->contentTypeDef = content;
	    if (WXS_IS_TYPE_NOT_FIXED(contentBase))
		xmlSchemaTypeFixup(contentBase, ACTXT_CAST pctxt);
	    /*
	    * Fixup the newly created type. We don't need to check
	    * for circularity here.
	    */
	    res = xmlSchemaFixupSimpleTypeStageOne(pctxt, content);
	    HFAILURE HERROR
	    res = xmlSchemaFixupSimpleTypeStageTwo(pctxt, content);
	    HFAILURE HERROR

	} else if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	    (WXS_IS_RESTRICTION(type))) {
	    /*
	    * SPEC (2) If <restriction> + base is a mixed <complexType> with
	    * an emptiable particle, then a simple type definition which
	    * restricts the <restriction>'s <simpleType> child.
	    */
	    if ((type->contentTypeDef == NULL) ||
		(type->contentTypeDef->baseType == NULL)) {
		/*
		* TODO: Check if this ever happens.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <simpleContent><restriction> "
		    "is missing a <simpleType> child, but was not caught "
		    "by xmlSchemaCheckSRCCT()", type->name);
		goto exit_failure;
	    }
	} else if ((WXS_IS_COMPLEX(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (3) If <extension> + base is <complexType> with
	    * <simpleType> content, "...then the {content type} of that
	    * complex type definition"
	    */
	    if (baseType->contentTypeDef == NULL) {
		/*
		* TODO: Check if this ever happens. xmlSchemaCheckSRCCT
		* should have caught this already.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <extension>ed base type is "
		    "a complex type with no simple content type",
		    type->name);
		goto exit_failure;
	    }
	    type->contentTypeDef = baseType->contentTypeDef;
	} else if ((WXS_IS_SIMPLE(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (4) <extension> + base is <simpleType>
	    * "... then that simple type definition"
	    */
	    type->contentTypeDef = baseType;
	} else {
	    /*
	    * TODO: Check if this ever happens.
	    */
	    xmlSchemaPCustomErr(pctxt,
		XML_SCHEMAP_INTERNAL,
		WXS_BASIC_CAST type, NULL,
		"Internal error: xmlSchemaTypeFixup, "
		"complex type '%s' with <simpleContent>: unhandled "
		"derivation case", type->name);
	    goto exit_failure;
	}
    } else {
	int dummySequence = 0;
	xmlSchemaParticlePtr particle =
	    (xmlSchemaParticlePtr) type->subtypes;
	/*
	* Corresponds to <complexType><complexContent>...
	*
	* NOTE that the effective mixed was already set during parsing of
	* <complexType> and <complexContent>; its flag value is
	* XML_SCHEMAS_TYPE_MIXED.
	*
	* Compute the "effective content":
	* (2.1.1) + (2.1.2) + (2.1.3)
	*/
	if ((particle == NULL) ||
	    ((particle->type == XML_SCHEMA_TYPE_PARTICLE) &&
	    ((particle->children->type == XML_SCHEMA_TYPE_ALL) ||
	    (particle->children->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	    ((particle->children->type == XML_SCHEMA_TYPE_CHOICE) &&
	    (particle->minOccurs == 0))) &&
	    ( ((xmlSchemaTreeItemPtr) particle->children)->children == NULL))) {
	    if (type->flags & XML_SCHEMAS_TYPE_MIXED) {
		/*
		* SPEC (2.1.4) "If the `effective mixed` is true, then
		* a particle whose properties are as follows:..."
		*
		* Empty sequence model group with
		* minOccurs/maxOccurs = 1 (i.e. a "particle emptiable").
		* NOTE that we sill assign it the <complexType> node to
		* somehow anchor it in the doc.
		*/
		if ((particle == NULL) ||
		    (particle->children->type != XML_SCHEMA_TYPE_SEQUENCE)) {
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the model group.
		    */ /* URGENT TODO: avoid adding to pending items. */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;

		    type->subtypes = (xmlSchemaTypePtr) particle;
		}
		dummySequence = 1;
		type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	    } else {
		/*
		* SPEC (2.1.5) "otherwise empty"
		*/
		type->contentType = XML_SCHEMA_CONTENT_EMPTY;
	    }
	} else {
	    /*
	    * SPEC (2.2) "otherwise the particle corresponding to the
	    * <all>, <choice>, <group> or <sequence> among the
	    * [children]."
	    */
	    type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	}
	/*
	* Compute the "content type".
	*/
	if (WXS_IS_RESTRICTION(type)) {
	    /*
	    * SPEC (3.1) "If <restriction>..."
	    * (3.1.1) + (3.1.2) */
	    if (type->contentType != XML_SCHEMA_CONTENT_EMPTY) {
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    }
	} else {
	    /*
	    * SPEC (3.2) "If <extension>..."
	    */
	    if (type->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.1)
		* "If the `effective content` is empty, then the
		*  {content type} of the [...] base ..."
		*/
		type->contentType = baseType->contentType;
		type->subtypes = baseType->subtypes;
		/*
		* Fixes bug #347316:
		* This is the case when the base type has a simple
		* type definition as content.
		*/
		type->contentTypeDef = baseType->contentTypeDef;
		/*
		* NOTE that the effective mixed is ignored here.
		*/
	    } else if (baseType->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.2)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    } else {
		/*
		* SPEC (3.2.3)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
		    /*
		    * "A model group whose {compositor} is sequence and whose
		    * {particles} are..."
		    */
		if ((WXS_TYPE_PARTICLE(type) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(type) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(type))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"The type has an 'all' model group in its "
			"{content type} and thus cannot be derived from "
			"a non-empty type, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((WXS_TYPE_PARTICLE(baseType) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(baseType) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(baseType))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"A type cannot be derived by extension from a type "
			"which has an 'all' model group in its "
			"{content type}, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((!dummySequence) && (baseType->subtypes != NULL)) {
		    xmlSchemaTreeItemPtr effectiveContent =
			(xmlSchemaTreeItemPtr) type->subtypes;
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the "sequence" model group.
		    */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;
		    WXS_TYPE_CONTENTTYPE(type) = (xmlSchemaTypePtr) particle;
		    /*
		    * SPEC "the particle of the {content type} of
		    * the ... base ..."
		    * Create a duplicate of the base type's particle
		    * and assign its "term" to it.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) xmlSchemaAddParticle(pctxt,
			type->node,
			((xmlSchemaParticlePtr) baseType->subtypes)->minOccurs,
			((xmlSchemaParticlePtr) baseType->subtypes)->maxOccurs);
		    if (particle->children->children == NULL)
			goto exit_failure;
		    particle = (xmlSchemaParticlePtr)
			particle->children->children;
		    particle->children =
			((xmlSchemaParticlePtr) baseType->subtypes)->children;
		    /*
		    * SPEC "followed by the `effective content`."
		    */
		    particle->next = effectiveContent;
		    /*
		    * This all will result in:
		    * new-particle
		    *   --> new-sequence(
		    *         new-particle
		    *           --> base-model,
		    *         this-particle
		    *	        --> this-model
		    *	    )
		    */
		} else {
		    /*
		    * This is the case when there is already an empty
		    * <sequence> with minOccurs==maxOccurs==1.
		    * Just add the base types's content type.
		    * NOTE that, although we miss to add an intermediate
		    * <sequence>, this should produce no difference to
		    * neither the regex compilation of the content model,
		    * nor to the complex type constraints.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) baseType->subtypes;
		}
	    }
	}
    }
    /*
    * Now fixup attribute uses:
    *   - expand attr. group references
    *     - intersect attribute wildcards
    *   - inherit attribute uses of the base type
    *   - inherit or union attr. wildcards if extending
    *   - apply attr. use prohibitions if restricting
    */
    res = xmlSchemaFixupTypeAttributeUses(pctxt, type);
    HFAILURE HERROR
    /*
    * Apply the complex type component constraints; this will not
    * check attributes, since this is done in
    * xmlSchemaFixupTypeAttributeUses().
    */
    res = xmlSchemaCheckCTComponent(pctxt, type);
    HFAILURE HERROR

    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    else
	return(0);

exit_error:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(pctxt->err);

exit_failure:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(-1);
}